

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O2

void __thiscall Scine::Core::ModuleManager::Impl::tryLoadModulesInPath(Impl *this,path *directory)

{
  bool bVar1;
  directory_iterator end;
  directory_iterator dStack_28;
  directory_iterator local_20;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_18;
  
  bVar1 = boost::filesystem::is_directory(directory);
  if (bVar1) {
    local_18.px = (dir_itr_imp *)0x0;
    boost::filesystem::directory_iterator::directory_iterator(&dStack_28,directory,none);
    local_20.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
    std::
    for_each<boost::filesystem::directory_iterator,Scine::Core::ModuleManager::Impl::tryLoadModulesInPath(boost::filesystem::path_const&)::_lambda(auto:1_const&)_1_>
              (&dStack_28,&local_20,(anon_class_8_1_8991fb9c)this);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_20.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&dStack_28.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_18);
  }
  return;
}

Assistant:

void tryLoadModulesInPath(const boost::filesystem::path& directory) {
    if (!boost::filesystem::is_directory(directory)) {
      return;
    }

    const boost::filesystem::directory_iterator end;
    std::for_each(boost::filesystem::directory_iterator(directory), end, [&](const auto& filePath) {
      if (patternMatchModuleLibrary(filePath.path().filename().string())) {
        try {
          this->load(filePath);
        }
        catch (...) {
        }
      }
    });
  }